

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O1

void do_modify_sniftab(uint value,uint mask,char cmd)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)idx;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if (((*(uint *)(sniftab[0].current.data + lVar2 + -8) ^ value) & mask) == 0) {
        *(uint *)(sniftab[0].last.data + lVar2 + -0x40) =
             *(uint *)(sniftab[0].last.data + lVar2 + -0x40) & 0xfffffffe | (uint)(cmd == '+');
      }
      lVar2 = lVar2 + 0x158;
    } while (lVar1 * 0x158 - lVar2 != 0);
  }
  return;
}

Assistant:

void do_modify_sniftab(unsigned int value, unsigned int mask, char cmd)
{
	int i;

	for (i = 0; i < idx ;i++) {
		if ((sniftab[i].current.can_id & mask) == (value & mask)) {
			if (cmd == '+')
				do_set(i, ENABLE);
			else
				do_clr(i, ENABLE);
		}
	}
}